

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration,int level)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  bool bVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  Car *pCVar31;
  ulong uVar32;
  ulong uVar33;
  undefined4 in_register_0000000c;
  bool *pbVar34;
  thread *t;
  long lVar35;
  pointer ptVar36;
  element_type *peVar37;
  int iVar38;
  Obstacle *o;
  pointer pOVar39;
  thread *c;
  Game *pGVar40;
  undefined4 uVar41;
  undefined4 uVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int iVar108;
  int iVar112;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  initializer_list<std::shared_ptr<Car>_> __l;
  bool running;
  string direction;
  shared_ptr<Car> car2;
  shared_ptr<Car> car1;
  vector<std::thread,_std::allocator<std::thread>_> cars;
  vector<Obstacle,_std::allocator<Obstacle>_> obstacles;
  vector<std::thread,_std::allocator<std::thread>_> obstacleThreads;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> carObjects;
  bool local_209;
  thread local_208;
  thread local_200;
  char *local_1f8;
  long local_1f0 [2];
  shared_ptr<Car> local_1e0;
  shared_ptr<Car> local_1d0;
  int local_1bc;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  undefined1 local_198 [16];
  pointer local_188;
  undefined8 local_178;
  Game *local_170;
  size_t local_168;
  Renderer *local_160;
  shared_ptr<Car> local_158;
  shared_ptr<Car> local_148;
  string local_138;
  undefined1 local_118 [16];
  Car *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_d8;
  pointer local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_78;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_60;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_48;
  
  local_178 = CONCAT44(in_register_0000000c,level);
  local_170 = this;
  local_168 = target_frame_duration;
  local_160 = renderer;
  local_1bc = SDL_GetTicks();
  auVar57._8_8_ = extraout_XMM1_Qb;
  auVar57._0_8_ = extraout_XMM1_Qa;
  local_209 = true;
  pCVar31 = (Car *)operator_new(0x68);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"horizontal","");
  pCVar31->_xpos = 0x1d6;
  pCVar31->_ypos = 0x1fe;
  pCVar31->_delay = 0x19;
  pCVar31->_active = true;
  pCVar31->_speed = -1;
  pCVar31->_limit = 0x280;
  (pCVar31->_axis)._M_dataplus._M_p = (pointer)&(pCVar31->_axis).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar31->_axis,local_98,local_90 + (long)local_98);
  pCVar31->_succeeded = false;
  *(undefined1 (*) [16])&(pCVar31->mtx).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(pCVar31->mtx).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (pCVar31->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar31;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Car*>
            (&local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pCVar31);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  pCVar31 = (Car *)operator_new(0x68);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"vertical","");
  pCVar31->_xpos = 0x25d;
  pCVar31->_ypos = 0x203;
  pCVar31->_delay = 0x19;
  pCVar31->_active = true;
  pCVar31->_speed = -1;
  pCVar31->_limit = 0x280;
  (pCVar31->_axis)._M_dataplus._M_p = (pointer)&(pCVar31->_axis).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar31->_axis,local_b8,local_b0 + (long)local_b8);
  pCVar31->_succeeded = false;
  *(undefined1 (*) [16])&(pCVar31->mtx).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(pCVar31->mtx).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (pCVar31->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar31;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Car*>
            (&local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pCVar31);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (pointer)0x0;
  local_118 = ZEXT816(0x1073a0);
  std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
            (&local_200,(offset_in_Car_to_subr *)local_118,&local_1d0);
  uVar26 = local_178;
  std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_1b8,&local_200);
  if (local_200._M_id._M_thread == 0) {
    local_118 = ZEXT816(0x1073a0);
    std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
              (&local_200,(offset_in_Car_to_subr *)local_118,&local_1e0);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_1b8,&local_200);
    if (local_200._M_id._M_thread == 0) {
      local_118._8_8_ =
           local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_118._0_8_ = local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_108 = local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_100 = local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      __l._M_len = 2;
      __l._M_array = (iterator)local_118;
      std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
                (&local_78,__l,(allocator_type *)&local_200);
      lVar35 = 0x20;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_118 + lVar35 + -8) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_118 + lVar35 + -8));
        }
        lVar35 = lVar35 + -0x10;
      } while (lVar35 != 0);
      local_198 = (undefined1  [16])0x0;
      local_188 = (pointer)0x0;
      if ((int)uVar26 < 1) {
        local_118._0_8_ = (element_type *)0x0;
        local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_108 = (Car *)0x0;
      }
      else {
        iVar38 = (int)uVar26 * 3;
        if (iVar38 < 2) {
          iVar38 = 1;
        }
        do {
          iVar28 = Randomizer::genRand<int>(1,600);
          iVar29 = Randomizer::genRand<int>(1,600);
          iVar30 = Randomizer::genRand<int>(1,2);
          local_200._M_id._M_thread = (id)local_1f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"vertical","");
          if (iVar30 == 1) {
            std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x1081f0);
            auVar57._8_8_ = extraout_XMM1_Qb_00;
            auVar57._0_8_ = extraout_XMM1_Qa_00;
          }
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_200._M_id._M_thread,
                     local_1f8 + (long)local_200._M_id._M_thread);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
                    (&local_48,&local_78);
          Obstacle::Obstacle((Obstacle *)local_118,iVar28,iVar29,600,1,&local_138,&local_48);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                    (&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          std::vector<Obstacle,_std::allocator<Obstacle>_>::emplace_back<Obstacle>
                    ((vector<Obstacle,_std::allocator<Obstacle>_> *)local_198,(Obstacle *)local_118)
          ;
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                    (&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_p != &local_e8) {
            operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
          }
          if (local_200._M_id._M_thread != (id)local_1f0) {
            operator_delete((void *)local_200._M_id._M_thread,local_1f0[0] + 1);
          }
          iVar38 = iVar38 + -1;
        } while (iVar38 != 0);
        uVar26 = local_198._8_8_;
        local_118._0_8_ = (element_type *)0x0;
        local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_108 = (Car *)0x0;
        if (local_198._0_8_ != local_198._8_8_) {
          pOVar39 = (pointer)local_198._0_8_;
          do {
            local_200._M_id._M_thread = (id)Obstacle::move;
            local_1f8 = (char *)0x0;
            local_c0 = pOVar39;
            std::thread::thread<void(Obstacle::*)(),Obstacle*,void>
                      (&local_208,(offset_in_Obstacle_to_subr *)&local_200,&local_c0);
            std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                      ((vector<std::thread,_std::allocator<std::thread>_> *)local_118,&local_208);
            if (local_208._M_id._M_thread != 0) goto LAB_001052c0;
            pOVar39 = pOVar39 + 1;
          } while (pOVar39 != (pointer)uVar26);
        }
      }
      if (local_209 == true) {
        iVar38 = 0;
        pGVar40 = local_170;
        do {
          iVar28 = SDL_GetTicks();
          local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          Mycontroller::HandleInput(&local_209,&local_148,&local_158);
          if (local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_158.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          if (local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          bVar27 = Car::isActive(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
          if ((!bVar27) &&
             (bVar27 = Car::isActive(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr), !bVar27)) {
            bVar27 = Car::get_success(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr);
            if ((bVar27) &&
               (bVar27 = Car::get_success(local_1e0.
                                          super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                         ), bVar27)) {
              local_209 = false;
              pGVar40->score = (pGVar40->score + 1) * (int)local_178;
              if (local_198._0_8_ != local_198._8_8_) {
                uVar32 = local_198._8_8_ + (-0x58 - local_198._0_8_);
                auVar66._8_8_ = 0;
                auVar66._0_8_ = uVar32;
                uVar41 = SUB164(auVar66 * ZEXT816(0x2e8ba2e8ba2e8ba3),8);
                uVar45 = (undefined4)(uVar32 / 0x580000000);
                auVar90._0_8_ = CONCAT44(uVar45,uVar41);
                auVar90._8_4_ = uVar41;
                auVar90._12_4_ = uVar45;
                auVar42._0_8_ = auVar90._0_8_ >> 4;
                auVar42._8_8_ = auVar90._8_8_ >> 4;
                pbVar34 = &((pointer)(local_198._0_8_ + 0x528))->_active;
                uVar33 = 0;
                do {
                  auVar46._8_4_ = (int)uVar33;
                  auVar46._0_8_ = uVar33;
                  auVar46._12_4_ = (int)(uVar33 >> 0x20);
                  auVar57 = auVar42 ^ _DAT_001081a0;
                  auVar66 = (auVar46 | _DAT_00108190) ^ _DAT_001081a0;
                  iVar29 = auVar57._0_4_;
                  iVar85 = -(uint)(iVar29 < auVar66._0_4_);
                  iVar30 = auVar57._4_4_;
                  auVar67._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                  iVar108 = auVar57._8_4_;
                  iVar89 = -(uint)(iVar108 < auVar66._8_4_);
                  iVar112 = auVar57._12_4_;
                  auVar67._12_4_ = -(uint)(iVar112 < auVar66._12_4_);
                  auVar78._4_4_ = iVar85;
                  auVar78._0_4_ = iVar85;
                  auVar78._8_4_ = iVar89;
                  auVar78._12_4_ = iVar89;
                  auVar57 = pshuflw(in_XMM6,auVar78,0xe8);
                  auVar68._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                  auVar68._12_4_ = -(uint)(auVar66._12_4_ == iVar112);
                  auVar68._0_4_ = auVar68._4_4_;
                  auVar68._8_4_ = auVar68._12_4_;
                  auVar90 = pshuflw(in_XMM7,auVar68,0xe8);
                  auVar67._0_4_ = auVar67._4_4_;
                  auVar67._8_4_ = auVar67._12_4_;
                  auVar66 = pshuflw(auVar57,auVar67,0xe8);
                  auVar66 = (auVar66 | auVar90 & auVar57) ^ _DAT_001081b0;
                  auVar66 = packssdw(auVar66,auVar66);
                  if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pbVar34[-0x528] = false;
                  }
                  auVar67 = auVar68 & auVar78 | auVar67;
                  auVar66 = packssdw(auVar67,auVar67);
                  auVar66 = packssdw(auVar66 ^ _DAT_001081b0,auVar66 ^ _DAT_001081b0);
                  auVar66 = packsswb(auVar66,auVar66);
                  if ((auVar66._0_4_ >> 8 & 1) != 0) {
                    pbVar34[-0x4d0] = false;
                  }
                  auVar66 = (auVar46 | _DAT_00108180) ^ _DAT_001081a0;
                  iVar85 = -(uint)(iVar29 < auVar66._0_4_);
                  auVar86._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                  iVar89 = -(uint)(iVar108 < auVar66._8_4_);
                  auVar86._12_4_ = -(uint)(iVar112 < auVar66._12_4_);
                  auVar93._4_4_ = iVar85;
                  auVar93._0_4_ = iVar85;
                  auVar93._8_4_ = iVar89;
                  auVar93._12_4_ = iVar89;
                  auVar95._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                  auVar95._12_4_ = -(uint)(auVar66._12_4_ == iVar112);
                  auVar95._0_4_ = auVar95._4_4_;
                  auVar95._8_4_ = auVar95._12_4_;
                  auVar86._0_4_ = auVar86._4_4_;
                  auVar86._8_4_ = auVar86._12_4_;
                  auVar66 = auVar95 & auVar93 | auVar86;
                  auVar66 = packssdw(auVar66,auVar66);
                  auVar66 = packssdw(auVar66 ^ _DAT_001081b0,auVar66 ^ _DAT_001081b0);
                  auVar66 = packsswb(auVar66,auVar66);
                  if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
                    pbVar34[-0x478] = false;
                  }
                  auVar68 = pshufhw(auVar93,auVar93,0x84);
                  auVar78 = pshufhw(auVar95,auVar95,0x84);
                  auVar67 = pshufhw(auVar68,auVar86,0x84);
                  auVar68 = (auVar67 | auVar78 & auVar68) ^ _DAT_001081b0;
                  auVar68 = packssdw(auVar68,auVar68);
                  auVar68 = packsswb(auVar68,auVar68);
                  if ((auVar68._0_4_ >> 0x18 & 1) != 0) {
                    pbVar34[-0x420] = false;
                  }
                  auVar68 = (auVar46 | _DAT_00108170) ^ _DAT_001081a0;
                  iVar85 = -(uint)(iVar29 < auVar68._0_4_);
                  auVar70._4_4_ = -(uint)(iVar30 < auVar68._4_4_);
                  iVar89 = -(uint)(iVar108 < auVar68._8_4_);
                  auVar70._12_4_ = -(uint)(iVar112 < auVar68._12_4_);
                  auVar79._4_4_ = iVar85;
                  auVar79._0_4_ = iVar85;
                  auVar79._8_4_ = iVar89;
                  auVar79._12_4_ = iVar89;
                  auVar66 = pshuflw(auVar66,auVar79,0xe8);
                  auVar69._4_4_ = -(uint)(auVar68._4_4_ == iVar30);
                  auVar69._12_4_ = -(uint)(auVar68._12_4_ == iVar112);
                  auVar69._0_4_ = auVar69._4_4_;
                  auVar69._8_4_ = auVar69._12_4_;
                  auVar90 = pshuflw(auVar90 & auVar57,auVar69,0xe8);
                  auVar70._0_4_ = auVar70._4_4_;
                  auVar70._8_4_ = auVar70._12_4_;
                  auVar57 = pshuflw(auVar66,auVar70,0xe8);
                  auVar57 = (auVar57 | auVar90 & auVar66) ^ _DAT_001081b0;
                  auVar57 = packssdw(auVar57,auVar57);
                  auVar57 = packsswb(auVar57,auVar57);
                  if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    pbVar34[-0x3c8] = false;
                  }
                  auVar70 = auVar69 & auVar79 | auVar70;
                  auVar57 = packssdw(auVar70,auVar70);
                  auVar57 = packssdw(auVar57 ^ _DAT_001081b0,auVar57 ^ _DAT_001081b0);
                  auVar57 = packsswb(auVar57,auVar57);
                  if ((auVar57._4_2_ >> 8 & 1) != 0) {
                    pbVar34[-0x370] = false;
                  }
                  auVar57 = (auVar46 | _DAT_00108160) ^ _DAT_001081a0;
                  iVar85 = -(uint)(iVar29 < auVar57._0_4_);
                  auVar87._4_4_ = -(uint)(iVar30 < auVar57._4_4_);
                  iVar89 = -(uint)(iVar108 < auVar57._8_4_);
                  auVar87._12_4_ = -(uint)(iVar112 < auVar57._12_4_);
                  auVar71._4_4_ = iVar85;
                  auVar71._0_4_ = iVar85;
                  auVar71._8_4_ = iVar89;
                  auVar71._12_4_ = iVar89;
                  auVar80._4_4_ = -(uint)(auVar57._4_4_ == iVar30);
                  auVar80._12_4_ = -(uint)(auVar57._12_4_ == iVar112);
                  auVar80._0_4_ = auVar80._4_4_;
                  auVar80._8_4_ = auVar80._12_4_;
                  auVar87._0_4_ = auVar87._4_4_;
                  auVar87._8_4_ = auVar87._12_4_;
                  auVar57 = auVar80 & auVar71 | auVar87;
                  auVar57 = packssdw(auVar57,auVar57);
                  auVar57 = packssdw(auVar57 ^ _DAT_001081b0,auVar57 ^ _DAT_001081b0);
                  auVar57 = packsswb(auVar57,auVar57);
                  if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    pbVar34[-0x318] = false;
                  }
                  auVar68 = pshufhw(auVar71,auVar71,0x84);
                  auVar78 = pshufhw(auVar80,auVar80,0x84);
                  auVar67 = pshufhw(auVar68,auVar87,0x84);
                  auVar68 = (auVar67 | auVar78 & auVar68) ^ _DAT_001081b0;
                  auVar68 = packssdw(auVar68,auVar68);
                  auVar68 = packsswb(auVar68,auVar68);
                  if ((auVar68._6_2_ >> 8 & 1) != 0) {
                    pbVar34[-0x2c0] = false;
                  }
                  auVar68 = (auVar46 | _DAT_00108150) ^ _DAT_001081a0;
                  iVar85 = -(uint)(iVar29 < auVar68._0_4_);
                  auVar73._4_4_ = -(uint)(iVar30 < auVar68._4_4_);
                  iVar89 = -(uint)(iVar108 < auVar68._8_4_);
                  auVar73._12_4_ = -(uint)(iVar112 < auVar68._12_4_);
                  auVar81._4_4_ = iVar85;
                  auVar81._0_4_ = iVar85;
                  auVar81._8_4_ = iVar89;
                  auVar81._12_4_ = iVar89;
                  auVar57 = pshuflw(auVar57,auVar81,0xe8);
                  auVar72._4_4_ = -(uint)(auVar68._4_4_ == iVar30);
                  auVar72._12_4_ = -(uint)(auVar68._12_4_ == iVar112);
                  auVar72._0_4_ = auVar72._4_4_;
                  auVar72._8_4_ = auVar72._12_4_;
                  auVar90 = pshuflw(auVar90 & auVar66,auVar72,0xe8);
                  auVar73._0_4_ = auVar73._4_4_;
                  auVar73._8_4_ = auVar73._12_4_;
                  auVar66 = pshuflw(auVar57,auVar73,0xe8);
                  auVar66 = (auVar66 | auVar90 & auVar57) ^ _DAT_001081b0;
                  auVar66 = packssdw(auVar66,auVar66);
                  auVar66 = packsswb(auVar66,auVar66);
                  if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pbVar34[-0x268] = false;
                  }
                  auVar73 = auVar72 & auVar81 | auVar73;
                  auVar66 = packssdw(auVar73,auVar73);
                  auVar66 = packssdw(auVar66 ^ _DAT_001081b0,auVar66 ^ _DAT_001081b0);
                  auVar66 = packsswb(auVar66,auVar66);
                  if ((auVar66._8_2_ >> 8 & 1) != 0) {
                    pbVar34[-0x210] = false;
                  }
                  auVar66 = (auVar46 | _DAT_00108140) ^ _DAT_001081a0;
                  iVar85 = -(uint)(iVar29 < auVar66._0_4_);
                  auVar88._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
                  iVar89 = -(uint)(iVar108 < auVar66._8_4_);
                  auVar88._12_4_ = -(uint)(iVar112 < auVar66._12_4_);
                  auVar74._4_4_ = iVar85;
                  auVar74._0_4_ = iVar85;
                  auVar74._8_4_ = iVar89;
                  auVar74._12_4_ = iVar89;
                  auVar82._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
                  auVar82._12_4_ = -(uint)(auVar66._12_4_ == iVar112);
                  auVar82._0_4_ = auVar82._4_4_;
                  auVar82._8_4_ = auVar82._12_4_;
                  auVar88._0_4_ = auVar88._4_4_;
                  auVar88._8_4_ = auVar88._12_4_;
                  auVar66 = auVar82 & auVar74 | auVar88;
                  auVar66 = packssdw(auVar66,auVar66);
                  auVar66 = packssdw(auVar66 ^ _DAT_001081b0,auVar66 ^ _DAT_001081b0);
                  auVar66 = packsswb(auVar66,auVar66);
                  if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    pbVar34[-0x1b8] = false;
                  }
                  auVar68 = pshufhw(auVar74,auVar74,0x84);
                  auVar78 = pshufhw(auVar82,auVar82,0x84);
                  auVar67 = pshufhw(auVar68,auVar88,0x84);
                  auVar68 = (auVar67 | auVar78 & auVar68) ^ _DAT_001081b0;
                  auVar68 = packssdw(auVar68,auVar68);
                  auVar68 = packsswb(auVar68,auVar68);
                  if ((auVar68._10_2_ >> 8 & 1) != 0) {
                    pbVar34[-0x160] = false;
                  }
                  auVar68 = (auVar46 | _DAT_00108130) ^ _DAT_001081a0;
                  iVar85 = -(uint)(iVar29 < auVar68._0_4_);
                  auVar76._4_4_ = -(uint)(iVar30 < auVar68._4_4_);
                  iVar89 = -(uint)(iVar108 < auVar68._8_4_);
                  auVar76._12_4_ = -(uint)(iVar112 < auVar68._12_4_);
                  auVar83._4_4_ = iVar85;
                  auVar83._0_4_ = iVar85;
                  auVar83._8_4_ = iVar89;
                  auVar83._12_4_ = iVar89;
                  auVar66 = pshuflw(auVar66,auVar83,0xe8);
                  auVar75._4_4_ = -(uint)(auVar68._4_4_ == iVar30);
                  auVar75._12_4_ = -(uint)(auVar68._12_4_ == iVar112);
                  auVar75._0_4_ = auVar75._4_4_;
                  auVar75._8_4_ = auVar75._12_4_;
                  in_XMM7 = pshuflw(auVar90 & auVar57,auVar75,0xe8);
                  in_XMM7 = in_XMM7 & auVar66;
                  auVar76._0_4_ = auVar76._4_4_;
                  auVar76._8_4_ = auVar76._12_4_;
                  auVar57 = pshuflw(auVar66,auVar76,0xe8);
                  auVar57 = (auVar57 | in_XMM7) ^ _DAT_001081b0;
                  auVar57 = packssdw(auVar57,auVar57);
                  in_XMM6 = packsswb(auVar57,auVar57);
                  if ((in_XMM6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    pbVar34[-0x108] = false;
                  }
                  auVar76 = auVar75 & auVar83 | auVar76;
                  auVar57 = packssdw(auVar76,auVar76);
                  auVar57 = packssdw(auVar57 ^ _DAT_001081b0,auVar57 ^ _DAT_001081b0);
                  auVar57 = packsswb(auVar57,auVar57);
                  if ((auVar57._12_2_ >> 8 & 1) != 0) {
                    pbVar34[-0xb0] = false;
                  }
                  auVar57 = (auVar46 | _DAT_00108120) ^ _DAT_001081a0;
                  auVar84._0_4_ = -(uint)(iVar29 < auVar57._0_4_);
                  auVar84._4_4_ = -(uint)(iVar30 < auVar57._4_4_);
                  auVar84._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
                  auVar84._12_4_ = -(uint)(iVar112 < auVar57._12_4_);
                  auVar77._4_4_ = auVar84._0_4_;
                  auVar77._0_4_ = auVar84._0_4_;
                  auVar77._8_4_ = auVar84._8_4_;
                  auVar77._12_4_ = auVar84._8_4_;
                  auVar47._4_4_ = -(uint)(auVar57._4_4_ == iVar30);
                  auVar47._12_4_ = -(uint)(auVar57._12_4_ == iVar112);
                  auVar47._0_4_ = auVar47._4_4_;
                  auVar47._8_4_ = auVar47._12_4_;
                  auVar58._4_4_ = auVar84._4_4_;
                  auVar58._0_4_ = auVar84._4_4_;
                  auVar58._8_4_ = auVar84._12_4_;
                  auVar58._12_4_ = auVar84._12_4_;
                  auVar57 = packssdw(auVar84,auVar47 & auVar77 | auVar58);
                  auVar57 = packssdw(auVar57 ^ _DAT_001081b0,auVar57 ^ _DAT_001081b0);
                  auVar57 = packsswb(auVar57,auVar57);
                  if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    pbVar34[-0x58] = false;
                  }
                  auVar90 = pshufhw(auVar77,auVar77,0x84);
                  auVar57 = pshufhw(auVar47,auVar47,0x84);
                  auVar66 = pshufhw(auVar58,auVar58,0x84);
                  in_XMM2 = (auVar66 | auVar57 & auVar90) ^ _DAT_001081b0;
                  auVar57 = packssdw(auVar57 & auVar90,in_XMM2);
                  auVar57 = packsswb(auVar57,auVar57);
                  if ((auVar57._14_2_ >> 8 & 1) != 0) {
                    *pbVar34 = false;
                  }
                  uVar33 = uVar33 + 0x10;
                  pbVar34 = pbVar34 + 0x580;
                } while ((uVar32 / 0x58 + 0x10 & 0x7fffffffffffff0) != uVar33);
              }
            }
            else {
              uVar26 = local_1b8._8_8_;
              for (ptVar36 = (pointer)local_1b8._0_8_; ptVar36 != (pointer)uVar26;
                  ptVar36 = ptVar36 + 1) {
                std::thread::join();
              }
              Car::set_xpos(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,500
                           );
              pGVar40 = local_170;
              Car::set_ypos(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,500
                           );
              Car::set_xpos(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            0x1c2);
              Car::set_ypos(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,600
                           );
              Car::set_active(local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              true);
              Car::set_active(local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              true);
              uVar26 = local_1b8._8_8_;
              local_1b8._8_8_ = (pointer)(local_1b8._8_8_ + -8);
              if (((((pointer)(uVar26 + -8))->_M_id)._M_thread != 0) ||
                 (local_1b8._8_8_ = (pointer)(uVar26 + -0x10),
                 (((pointer)(uVar26 + -0x10))->_M_id)._M_thread != 0)) goto LAB_001052c0;
              local_200._M_id._M_thread = (id)Car::move;
              local_1f8 = (char *)0x0;
              std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                        (&local_208,(offset_in_Car_to_subr *)&local_200,&local_1d0);
              std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                        ((vector<std::thread,_std::allocator<std::thread>_> *)local_1b8,&local_208);
              if (local_208._M_id._M_thread != 0) goto LAB_001052c0;
              local_200._M_id._M_thread = (id)Car::move;
              local_1f8 = (char *)0x0;
              std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                        (&local_208,(offset_in_Car_to_subr *)&local_200,&local_1e0);
              std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                        ((vector<std::thread,_std::allocator<std::thread>_> *)local_1b8,&local_208);
              if (local_208._M_id._M_thread != 0) goto LAB_001052c0;
            }
          }
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
                    (&local_60,&local_78);
          Renderer::Render(local_160,(vector<Obstacle,_std::allocator<Obstacle>_> *)local_198,
                           &local_60);
          std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                    (&local_60);
          iVar29 = SDL_GetTicks();
          auVar57._8_8_ = extraout_XMM1_Qb_01;
          auVar57._0_8_ = extraout_XMM1_Qa_01;
          iVar38 = iVar38 + 1;
          if (999 < (uint)(iVar29 - local_1bc)) {
            Renderer::UpdateWindowTitle(local_160,pGVar40->score,iVar38);
            iVar38 = 0;
            local_1bc = iVar29;
          }
          if ((uint)(iVar29 - iVar28) < local_168) {
            SDL_Delay((int)local_168 - (iVar29 - iVar28));
            auVar57._8_8_ = extraout_XMM1_Qb_02;
            auVar57._0_8_ = extraout_XMM1_Qa_02;
          }
        } while (local_209 != false);
      }
      auVar78 = _DAT_001081a0;
      auVar67 = _DAT_00108190;
      auVar68 = _DAT_00108180;
      auVar46 = _DAT_00108170;
      auVar42 = _DAT_00108160;
      auVar90 = _DAT_00108150;
      auVar66 = _DAT_00108140;
      if (local_198._0_8_ != local_198._8_8_) {
        uVar32 = local_198._8_8_ + (-0x58 - local_198._0_8_);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar32;
        uVar41 = SUB164(auVar1 * ZEXT816(0x2e8ba2e8ba2e8ba3),8);
        uVar45 = (undefined4)(uVar32 / 0x580000000);
        auVar43._0_8_ = CONCAT44(uVar45,uVar41);
        auVar43._8_4_ = uVar41;
        auVar43._12_4_ = uVar45;
        auVar44._0_8_ = auVar43._0_8_ >> 4;
        auVar44._8_8_ = auVar43._8_8_ >> 4;
        pbVar34 = &((pointer)(local_198._0_8_ + 0x528))->_active;
        uVar33 = 0;
        do {
          auVar91._8_4_ = (int)uVar33;
          auVar91._0_8_ = uVar33;
          auVar91._12_4_ = (int)(uVar33 >> 0x20);
          auVar93 = auVar44 ^ auVar78;
          auVar95 = (auVar91 | auVar67) ^ auVar78;
          iVar38 = auVar93._0_4_;
          iVar108 = -(uint)(iVar38 < auVar95._0_4_);
          iVar28 = auVar93._4_4_;
          auVar97._4_4_ = -(uint)(iVar28 < auVar95._4_4_);
          iVar29 = auVar93._8_4_;
          iVar112 = -(uint)(iVar29 < auVar95._8_4_);
          iVar30 = auVar93._12_4_;
          auVar97._12_4_ = -(uint)(iVar30 < auVar95._12_4_);
          auVar12._4_4_ = iVar108;
          auVar12._0_4_ = iVar108;
          auVar12._8_4_ = iVar112;
          auVar12._12_4_ = iVar112;
          auVar57 = pshuflw(auVar57,auVar12,0xe8);
          auVar96._4_4_ = -(uint)(auVar95._4_4_ == iVar28);
          auVar96._12_4_ = -(uint)(auVar95._12_4_ == iVar30);
          auVar96._0_4_ = auVar96._4_4_;
          auVar96._8_4_ = auVar96._12_4_;
          auVar95 = pshuflw(in_XMM2,auVar96,0xe8);
          auVar97._0_4_ = auVar97._4_4_;
          auVar97._8_4_ = auVar97._12_4_;
          auVar93 = pshuflw(auVar57,auVar97,0xe8);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar93 | auVar95 & auVar57) ^ auVar48;
          auVar57 = packssdw(auVar48,auVar48);
          if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pbVar34[-0x528] = false;
          }
          auVar13._4_4_ = iVar108;
          auVar13._0_4_ = iVar108;
          auVar13._8_4_ = iVar112;
          auVar13._12_4_ = iVar112;
          auVar97 = auVar96 & auVar13 | auVar97;
          auVar57 = packssdw(auVar97,auVar97);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar2,auVar57 ^ auVar2);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._0_4_ >> 8 & 1) != 0) {
            pbVar34[-0x4d0] = false;
          }
          auVar57 = (auVar91 | auVar68) ^ auVar78;
          auVar59._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar59._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar59._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar59._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar98._4_4_ = auVar59._0_4_;
          auVar98._0_4_ = auVar59._0_4_;
          auVar98._8_4_ = auVar59._8_4_;
          auVar98._12_4_ = auVar59._8_4_;
          iVar108 = -(uint)(auVar57._4_4_ == iVar28);
          iVar112 = -(uint)(auVar57._12_4_ == iVar30);
          auVar14._4_4_ = iVar108;
          auVar14._0_4_ = iVar108;
          auVar14._8_4_ = iVar112;
          auVar14._12_4_ = iVar112;
          auVar109._4_4_ = auVar59._4_4_;
          auVar109._0_4_ = auVar59._4_4_;
          auVar109._8_4_ = auVar59._12_4_;
          auVar109._12_4_ = auVar59._12_4_;
          auVar57 = auVar14 & auVar98 | auVar109;
          auVar57 = packssdw(auVar57,auVar57);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar3,auVar57 ^ auVar3);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
            pbVar34[-0x478] = false;
          }
          auVar57 = pshufhw(auVar57,auVar98,0x84);
          auVar15._4_4_ = iVar108;
          auVar15._0_4_ = iVar108;
          auVar15._8_4_ = iVar112;
          auVar15._12_4_ = iVar112;
          auVar95 = pshufhw(auVar59,auVar15,0x84);
          auVar93 = pshufhw(auVar57,auVar109,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar93 | auVar95 & auVar57) ^ auVar49;
          auVar57 = packssdw(auVar49,auVar49);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
            pbVar34[-0x420] = false;
          }
          auVar57 = (auVar91 | auVar46) ^ auVar78;
          auVar60._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar60._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar60._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar60._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar16._4_4_ = auVar60._0_4_;
          auVar16._0_4_ = auVar60._0_4_;
          auVar16._8_4_ = auVar60._8_4_;
          auVar16._12_4_ = auVar60._8_4_;
          auVar95 = pshuflw(auVar109,auVar16,0xe8);
          auVar50._0_4_ = -(uint)(auVar57._0_4_ == iVar38);
          auVar50._4_4_ = -(uint)(auVar57._4_4_ == iVar28);
          auVar50._8_4_ = -(uint)(auVar57._8_4_ == iVar29);
          auVar50._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
          auVar99._4_4_ = auVar50._4_4_;
          auVar99._0_4_ = auVar50._4_4_;
          auVar99._8_4_ = auVar50._12_4_;
          auVar99._12_4_ = auVar50._12_4_;
          auVar57 = pshuflw(auVar50,auVar99,0xe8);
          auVar100._4_4_ = auVar60._4_4_;
          auVar100._0_4_ = auVar60._4_4_;
          auVar100._8_4_ = auVar60._12_4_;
          auVar100._12_4_ = auVar60._12_4_;
          auVar93 = pshuflw(auVar60,auVar100,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 & auVar95,(auVar93 | auVar57 & auVar95) ^ auVar4);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pbVar34[-0x3c8] = false;
          }
          auVar17._4_4_ = auVar60._0_4_;
          auVar17._0_4_ = auVar60._0_4_;
          auVar17._8_4_ = auVar60._8_4_;
          auVar17._12_4_ = auVar60._8_4_;
          auVar100 = auVar99 & auVar17 | auVar100;
          auVar93 = packssdw(auVar100,auVar100);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57,auVar93 ^ auVar5);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._4_2_ >> 8 & 1) != 0) {
            pbVar34[-0x370] = false;
          }
          auVar57 = (auVar91 | auVar42) ^ auVar78;
          auVar61._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar61._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar61._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar61._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar101._4_4_ = auVar61._0_4_;
          auVar101._0_4_ = auVar61._0_4_;
          auVar101._8_4_ = auVar61._8_4_;
          auVar101._12_4_ = auVar61._8_4_;
          iVar108 = -(uint)(auVar57._4_4_ == iVar28);
          iVar112 = -(uint)(auVar57._12_4_ == iVar30);
          auVar18._4_4_ = iVar108;
          auVar18._0_4_ = iVar108;
          auVar18._8_4_ = iVar112;
          auVar18._12_4_ = iVar112;
          auVar110._4_4_ = auVar61._4_4_;
          auVar110._0_4_ = auVar61._4_4_;
          auVar110._8_4_ = auVar61._12_4_;
          auVar110._12_4_ = auVar61._12_4_;
          auVar57 = auVar18 & auVar101 | auVar110;
          auVar57 = packssdw(auVar57,auVar57);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar6,auVar57 ^ auVar6);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pbVar34[-0x318] = false;
          }
          auVar57 = pshufhw(auVar57,auVar101,0x84);
          auVar19._4_4_ = iVar108;
          auVar19._0_4_ = iVar108;
          auVar19._8_4_ = iVar112;
          auVar19._12_4_ = iVar112;
          auVar95 = pshufhw(auVar61,auVar19,0x84);
          auVar93 = pshufhw(auVar57,auVar110,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar93 | auVar95 & auVar57) ^ auVar51;
          auVar57 = packssdw(auVar51,auVar51);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._6_2_ >> 8 & 1) != 0) {
            pbVar34[-0x2c0] = false;
          }
          auVar57 = (auVar91 | auVar90) ^ auVar78;
          auVar62._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar62._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar62._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar62._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar20._4_4_ = auVar62._0_4_;
          auVar20._0_4_ = auVar62._0_4_;
          auVar20._8_4_ = auVar62._8_4_;
          auVar20._12_4_ = auVar62._8_4_;
          auVar95 = pshuflw(auVar110,auVar20,0xe8);
          auVar52._0_4_ = -(uint)(auVar57._0_4_ == iVar38);
          auVar52._4_4_ = -(uint)(auVar57._4_4_ == iVar28);
          auVar52._8_4_ = -(uint)(auVar57._8_4_ == iVar29);
          auVar52._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
          auVar102._4_4_ = auVar52._4_4_;
          auVar102._0_4_ = auVar52._4_4_;
          auVar102._8_4_ = auVar52._12_4_;
          auVar102._12_4_ = auVar52._12_4_;
          auVar57 = pshuflw(auVar52,auVar102,0xe8);
          auVar103._4_4_ = auVar62._4_4_;
          auVar103._0_4_ = auVar62._4_4_;
          auVar103._8_4_ = auVar62._12_4_;
          auVar103._12_4_ = auVar62._12_4_;
          auVar93 = pshuflw(auVar62,auVar103,0xe8);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar93 | auVar57 & auVar95) ^ auVar63;
          auVar93 = packssdw(auVar63,auVar63);
          auVar57 = packsswb(auVar57 & auVar95,auVar93);
          if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pbVar34[-0x268] = false;
          }
          auVar21._4_4_ = auVar62._0_4_;
          auVar21._0_4_ = auVar62._0_4_;
          auVar21._8_4_ = auVar62._8_4_;
          auVar21._12_4_ = auVar62._8_4_;
          auVar103 = auVar102 & auVar21 | auVar103;
          auVar93 = packssdw(auVar103,auVar103);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar93 = packssdw(auVar93 ^ auVar7,auVar93 ^ auVar7);
          auVar57 = packsswb(auVar57,auVar93);
          if ((auVar57._8_2_ >> 8 & 1) != 0) {
            pbVar34[-0x210] = false;
          }
          auVar57 = (auVar91 | auVar66) ^ auVar78;
          auVar64._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar64._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar64._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar64._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar104._4_4_ = auVar64._0_4_;
          auVar104._0_4_ = auVar64._0_4_;
          auVar104._8_4_ = auVar64._8_4_;
          auVar104._12_4_ = auVar64._8_4_;
          iVar108 = -(uint)(auVar57._4_4_ == iVar28);
          iVar112 = -(uint)(auVar57._12_4_ == iVar30);
          auVar22._4_4_ = iVar108;
          auVar22._0_4_ = iVar108;
          auVar22._8_4_ = iVar112;
          auVar22._12_4_ = iVar112;
          auVar111._4_4_ = auVar64._4_4_;
          auVar111._0_4_ = auVar64._4_4_;
          auVar111._8_4_ = auVar64._12_4_;
          auVar111._12_4_ = auVar64._12_4_;
          auVar57 = auVar22 & auVar104 | auVar111;
          auVar57 = packssdw(auVar57,auVar57);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar8,auVar57 ^ auVar8);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pbVar34[-0x1b8] = false;
          }
          auVar57 = pshufhw(auVar57,auVar104,0x84);
          auVar23._4_4_ = iVar108;
          auVar23._0_4_ = iVar108;
          auVar23._8_4_ = iVar112;
          auVar23._12_4_ = iVar112;
          auVar95 = pshufhw(auVar64,auVar23,0x84);
          auVar93 = pshufhw(auVar57,auVar111,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar93 | auVar95 & auVar57) ^ auVar53;
          auVar57 = packssdw(auVar53,auVar53);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._10_2_ >> 8 & 1) != 0) {
            pbVar34[-0x160] = false;
          }
          auVar57 = (auVar91 | _DAT_00108130) ^ auVar78;
          auVar65._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar65._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar65._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar65._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar24._4_4_ = auVar65._0_4_;
          auVar24._0_4_ = auVar65._0_4_;
          auVar24._8_4_ = auVar65._8_4_;
          auVar24._12_4_ = auVar65._8_4_;
          auVar95 = pshuflw(auVar111,auVar24,0xe8);
          auVar54._0_4_ = -(uint)(auVar57._0_4_ == iVar38);
          auVar54._4_4_ = -(uint)(auVar57._4_4_ == iVar28);
          auVar54._8_4_ = -(uint)(auVar57._8_4_ == iVar29);
          auVar54._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
          auVar105._4_4_ = auVar54._4_4_;
          auVar105._0_4_ = auVar54._4_4_;
          auVar105._8_4_ = auVar54._12_4_;
          auVar105._12_4_ = auVar54._12_4_;
          auVar57 = pshuflw(auVar54,auVar105,0xe8);
          auVar106._4_4_ = auVar65._4_4_;
          auVar106._0_4_ = auVar65._4_4_;
          auVar106._8_4_ = auVar65._12_4_;
          auVar106._12_4_ = auVar65._12_4_;
          auVar93 = pshuflw(auVar65,auVar106,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 & auVar95,(auVar93 | auVar57 & auVar95) ^ auVar9);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pbVar34[-0x108] = false;
          }
          auVar25._4_4_ = auVar65._0_4_;
          auVar25._0_4_ = auVar65._0_4_;
          auVar25._8_4_ = auVar65._8_4_;
          auVar25._12_4_ = auVar65._8_4_;
          auVar106 = auVar105 & auVar25 | auVar106;
          auVar93 = packssdw(auVar106,auVar106);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57,auVar93 ^ auVar10);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._12_2_ >> 8 & 1) != 0) {
            pbVar34[-0xb0] = false;
          }
          auVar57 = (auVar91 | _DAT_00108120) ^ auVar78;
          auVar55._0_4_ = -(uint)(iVar38 < auVar57._0_4_);
          auVar55._4_4_ = -(uint)(iVar28 < auVar57._4_4_);
          auVar55._8_4_ = -(uint)(iVar29 < auVar57._8_4_);
          auVar55._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
          auVar107._4_4_ = auVar55._0_4_;
          auVar107._0_4_ = auVar55._0_4_;
          auVar107._8_4_ = auVar55._8_4_;
          auVar107._12_4_ = auVar55._8_4_;
          auVar92._4_4_ = -(uint)(auVar57._4_4_ == iVar28);
          auVar92._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
          auVar92._0_4_ = auVar92._4_4_;
          auVar92._8_4_ = auVar92._12_4_;
          auVar94._4_4_ = auVar55._4_4_;
          auVar94._0_4_ = auVar55._4_4_;
          auVar94._8_4_ = auVar55._12_4_;
          auVar94._12_4_ = auVar55._12_4_;
          auVar93 = auVar92 & auVar107 | auVar94;
          auVar57 = packssdw(auVar55,auVar93);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar57 = packssdw(auVar57 ^ auVar11,auVar57 ^ auVar11);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pbVar34[-0x58] = false;
          }
          auVar57 = pshufhw(auVar57,auVar107,0x84);
          in_XMM2 = pshufhw(auVar93,auVar92,0x84);
          in_XMM2 = in_XMM2 & auVar57;
          auVar57 = pshufhw(auVar57,auVar94,0x84);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar57 | in_XMM2) ^ auVar56;
          auVar57 = packssdw(auVar56,auVar56);
          auVar57 = packsswb(auVar57,auVar57);
          if ((auVar57._14_2_ >> 8 & 1) != 0) {
            *pbVar34 = false;
          }
          uVar33 = uVar33 + 0x10;
          pbVar34 = pbVar34 + 0x580;
        } while ((uVar32 / 0x58 + 0x10 & 0x7fffffffffffff0) != uVar33);
      }
      (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_active = false;
      (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_active = false;
      uVar26 = local_1b8._8_8_;
      for (ptVar36 = (pointer)local_1b8._0_8_; ptVar36 != (pointer)uVar26; ptVar36 = ptVar36 + 1) {
        std::thread::join();
      }
      uVar26 = local_118._8_8_;
      for (peVar37 = (element_type *)local_118._0_8_; peVar37 != (element_type *)uVar26;
          peVar37 = (element_type *)&peVar37->_delay) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_118);
      std::vector<Obstacle,_std::allocator<Obstacle>_>::~vector
                ((vector<Obstacle,_std::allocator<Obstacle>_> *)local_198);
      std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector(&local_78);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_1b8);
      if (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d0.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      return;
    }
  }
LAB_001052c0:
  std::terminate();
}

Assistant:

void Game::Run( Renderer &renderer,
               std::size_t target_frame_duration, int level) {
  Uint32 title_timestamp = SDL_GetTicks();
  Uint32 frame_start;
  Uint32 frame_end;
  Uint32 frame_duration;
  int frame_count = 0;
  bool running = true;


//---------Cars ---------------
  std::shared_ptr<Car> car1( new Car {470, 510, 640,-1, "horizontal"});
  std::shared_ptr<Car> car2 (new Car {605, 515, 640, -1, "vertical"});

  std::vector<std::thread> cars ;
  cars.emplace_back(std::thread(&Car::move, car1));
  cars.emplace_back(std::thread(&Car::move, car2));
  std::vector<std::shared_ptr<Car>> carObjects {car1,car2};
//-------------------------------



//--------Obstacles --------------
  std::vector<Obstacle> obstacles;

  for( int i = 0 ; i < level * 3; i++){
    int x = Randomizer::genRand(1,600);
    int y = Randomizer::genRand(1,600);
    int d = Randomizer::genRand(1,2);
    std::string direction = "vertical";

    if(d==1){
      direction = "horizontal";
    }
    //creating more obstacles (in every level)
    Obstacle obstacle {x,y, 600,1,direction,carObjects};
    obstacles.emplace_back(std::move(obstacle));
  }
  std::vector<std::thread> obstacleThreads;

  for ( auto& o : obstacles){
    obstacleThreads.emplace_back(std::thread(&Obstacle::move,&o));
  }
//-------------------------------



  while (running) {
    frame_start = SDL_GetTicks();

    // Input, [Update,] Render - the main game loop.
    //notice that the controller is automatically updating the object positions
    //so no need to create a method update()
    Mycontroller::HandleInput(running,car1,car2);

    
  // if cars are deactivated, then either reset or move to a new level
    if(car1->isActive()==false && car2->isActive() ==false){
       if(car1->get_success()==true && car2->get_success() ==true){
          running = false;
          score++;
          score *= level;
          for(auto& o : obstacles){
            o.deactivate();
          }
      }else{

      for(auto& c : cars){
        //std::cout <<"trying to join\n"<<std::endl;
        c.join();
        //std::cout <<"success  join\n"<<std::endl;
      }

      car1->set_xpos(500);
      car1->set_ypos(500);
      car2->set_xpos(450);
      car2->set_ypos(600);
      car1->set_active(true);
      car2->set_active(true);
       
      cars.pop_back();
      cars.pop_back();
       
      cars.emplace_back(std::thread(&Car::move, car1));
      cars.emplace_back(std::thread(&Car::move, car2));
      }

    }

    
    renderer.Render(obstacles, carObjects);

    frame_end = SDL_GetTicks();

    // Keep track of how long each loop through the input/update/render cycle
    // takes.
    frame_count++;
    frame_duration = frame_end - frame_start;

    // After every second, update the window title.
    if (frame_end - title_timestamp >= 1000) {
      renderer.UpdateWindowTitle(score, frame_count);
      frame_count = 0;
      title_timestamp = frame_end;
    }

    // If the time for this frame is too small (i.e. frame_duration is
    // smaller than the target ms_per_frame), delay the loop to
    // achieve the correct frame rate.
    if (frame_duration < target_frame_duration) {
      SDL_Delay(target_frame_duration - frame_duration);
    }
  }


// make sure that all threads will stop and join
  for(auto& o : obstacles){
    o.deactivate();
  }
  
  car1->deactivate();
  car2->deactivate();

for( auto& t : cars){
  t.join();
}

for(auto& t : obstacleThreads){
  t.join();
}
}